

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::LinkedListPool
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this,int chunkSize,
          size_t min_t_size)

{
  int iVar1;
  size_t sVar2;
  
  (this->v_).
  super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_).
  super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_).
  super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = 1;
  if (1 < chunkSize) {
    iVar1 = chunkSize;
  }
  sVar2 = 0x30;
  if (0x30 < min_t_size) {
    sVar2 = min_t_size;
  }
  this->chunkSize_ = iVar1;
  this->minTSize_ = (int)sVar2;
  (this->head_)._M_b._M_p = (__pointer_type)0x0;
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  allocate(this);
  return;
}

Assistant:

LinkedListPool(const int chunkSize = 1, const size_t min_t_size = sizeof(T)) :
  chunkSize_{(chunkSize < 1) ? 1 : chunkSize},
  minTSize_{static_cast<int>((sizeof(T) > min_t_size) ? sizeof(T) : min_t_size)},
  head_{nullptr}
  {
    allocate();
  }